

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::T_formatter<spdlog::details::scoped_padder>::format
          (T_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  ulong uVar2;
  scoped_padder p;
  scoped_padder sStack_38;
  
  scoped_padder::scoped_padder(&sStack_38,8,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2(tm_time->tm_hour,dest);
  sVar1 = (dest->super_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar2;
  (dest->super_buffer<char>).ptr_[sVar1] = ':';
  fmt_helper::pad2(tm_time->tm_min,dest);
  sVar1 = (dest->super_buffer<char>).size_;
  uVar2 = sVar1 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar1 = (dest->super_buffer<char>).size_;
    uVar2 = sVar1 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar2;
  (dest->super_buffer<char>).ptr_[sVar1] = ':';
  fmt_helper::pad2(tm_time->tm_sec,dest);
  scoped_padder::~scoped_padder(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }